

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::UniDirectionalLSTMLayerParams::MergePartialFromCodedStream
          (UniDirectionalLSTMLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint extraout_EAX;
  uint32 uVar6;
  Type *this_00;
  LSTMWeightParams *this_01;
  ulong extraout_RAX;
  uint8 *puVar7;
  LSTMParams *this_02;
  ulong extraout_RAX_00;
  pair<int,_int> pVar8;
  int byte_limit;
  int iVar9;
  char cVar10;
  uint uVar11;
  ulong uVar12;
  pair<unsigned_long,_bool> pVar13;
  int local_58;
  int local_54;
  
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar6 = (uint32)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar11 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        if ((input->buffer_end_ <= pbVar1) || ((~(uint)*pbVar1 & uVar11) < 0x80)) goto LAB_00225a5f;
        uVar11 = ((uint)bVar2 + (uint)*pbVar1 * 0x80) - 0x80;
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = (ulong)uVar11 | 0x100000000;
    }
    else {
LAB_00225a5f:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar12 = 0;
      if (uVar6 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar6 | uVar12;
    }
    uVar11 = (uint)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_002257e5;
    uVar5 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar12;
    if (uVar5 < 0xf) {
      if (uVar5 == 1) {
        if (cVar10 != '\b') goto LAB_002257e5;
        puVar7 = input->buffer_;
        if ((puVar7 < input->buffer_end_) && (-1 < (long)(char)*puVar7)) {
          this->inputvectorsize_ = (long)(char)*puVar7;
          goto LAB_00225939;
        }
        pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->inputvectorsize_ = pVar13.first;
LAB_002259e4:
        if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_00225814;
LAB_002259ed:
        iVar9 = 6;
      }
      else {
        if (uVar5 != 2) {
          if ((uVar5 == 10) && (cVar10 == 'R')) {
            this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                      Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                                (&(this->activations_).super_RepeatedPtrFieldBase,(Type *)0x0);
            puVar7 = input->buffer_;
            if ((puVar7 < input->buffer_end_) &&
               (byte_limit = (int)(char)*puVar7, -1 < (char)*puVar7)) {
              input->buffer_ = puVar7 + 1;
              bVar4 = true;
            }
            else {
              byte_limit = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback
                                     (input);
              bVar4 = -1 < byte_limit;
            }
            iVar9 = 6;
            if ((((bVar4) &&
                 (pVar8 = google::protobuf::io::CodedInputStream::
                          IncrementRecursionDepthAndPushLimit(input,byte_limit), -1 < (long)pVar8))
                && (bVar4 = ActivationParams::MergePartialFromCodedStream(this_00,input), bVar4)) &&
               (bVar4 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                                  (input,pVar8.first), bVar4)) goto LAB_00225814;
            goto LAB_00225817;
          }
          goto LAB_002257e5;
        }
        if (cVar10 != '\x10') goto LAB_002257e5;
        puVar7 = input->buffer_;
        if ((input->buffer_end_ <= puVar7) || ((long)(char)*puVar7 < 0)) {
          pVar13 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->outputvectorsize_ = pVar13.first;
          goto LAB_002259e4;
        }
        this->outputvectorsize_ = (long)(char)*puVar7;
LAB_00225939:
        input->buffer_ = puVar7 + 1;
LAB_00225814:
        iVar9 = 0;
      }
    }
    else if (uVar5 == 0xf) {
      if (cVar10 != 'z') goto LAB_002257e5;
      if (this->params_ == (LSTMParams *)0x0) {
        this_02 = (LSTMParams *)operator_new(0x20);
        LSTMParams::LSTMParams(this_02);
        this->params_ = this_02;
      }
      MergePartialFromCodedStream();
      iVar9 = local_54;
      uVar12 = extraout_RAX_00;
joined_r0x00225988:
      if ((uVar12 & 1) == 0) goto LAB_00225814;
    }
    else {
      if (uVar5 == 0x14) {
        if (cVar10 == -0x5e) {
          if (this->weightparams_ == (LSTMWeightParams *)0x0) {
            this_01 = (LSTMWeightParams *)operator_new(0x90);
            LSTMWeightParams::LSTMWeightParams(this_01);
            this->weightparams_ = this_01;
          }
          MergePartialFromCodedStream();
          iVar9 = local_58;
          uVar12 = extraout_RAX;
          goto joined_r0x00225988;
        }
      }
      else if (uVar5 == 100) {
        MergePartialFromCodedStream();
        if ((short)extraout_EAX == 1) goto LAB_002259ed;
        if ((extraout_EAX & 0xffff) != 0) goto LAB_00225814;
      }
LAB_002257e5:
      iVar9 = 7;
      if ((uVar11 & 7) != 4 && uVar11 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar11);
        if (!bVar4) goto LAB_002259ed;
        goto LAB_00225814;
      }
    }
LAB_00225817:
    if (iVar9 != 0) {
      return iVar9 != 6;
    }
  } while( true );
}

Assistant:

bool UniDirectionalLSTMLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.UniDirectionalLSTMLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activations = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activations()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMParams params = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_params()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMWeightParams weightParams = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_weightparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool reverseInput = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(800u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &reverseinput_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.UniDirectionalLSTMLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.UniDirectionalLSTMLayerParams)
  return false;
#undef DO_
}